

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O3

numeric_type __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::eval
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this,
          vector<double,_std::allocator<double>_> *param_1)

{
  expression_not_evaluable_exception *this_00;
  string local_40;
  
  this_00 = (expression_not_evaluable_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot evaluate rt_function_symbol!","");
  expression_not_evaluable_exception::expression_not_evaluable_exception(this_00,&local_40);
  __cxa_throw(this_00,&expression_not_evaluable_exception::typeinfo,
              expression_not_evaluable_exception::~expression_not_evaluable_exception);
}

Assistant:

numeric_type eval(std::vector<double> const & /*v*/) const { throw expression_not_evaluable_exception("Cannot evaluate rt_function_symbol!"); }